

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

double __thiscall sector_t::FindLowestFloorSurrounding(sector_t *this,vertex_t **v)

{
  line_t *line;
  sector_t *psVar1;
  double dVar2;
  double dVar3;
  vertex_t *local_50;
  vertex_t *spot;
  double ofloor;
  double floor;
  line_t *check;
  sector_t *other;
  int i;
  vertex_t **v_local;
  sector_t *this_local;
  
  if (this->linecount == 0) {
    this_local = (sector_t *)GetPlaneTexZ(this,0);
  }
  else {
    local_50 = (*this->lines)->v1;
    ofloor = secplane_t::ZatPoint(&this->floorplane,local_50);
    for (other._4_4_ = 0; other._4_4_ < this->linecount; other._4_4_ = other._4_4_ + 1) {
      line = this->lines[other._4_4_];
      psVar1 = getNextSector(line,this);
      if (psVar1 != (sector_t *)0x0) {
        dVar2 = secplane_t::ZatPoint(&psVar1->floorplane,line->v1);
        if ((dVar2 < ofloor) &&
           (dVar3 = secplane_t::ZatPoint(&this->floorplane,line->v1), dVar2 < dVar3)) {
          local_50 = line->v1;
          ofloor = dVar2;
        }
        dVar2 = secplane_t::ZatPoint(&psVar1->floorplane,line->v2);
        if ((dVar2 < ofloor) &&
           (dVar3 = secplane_t::ZatPoint(&this->floorplane,line->v2), dVar2 < dVar3)) {
          local_50 = line->v2;
          ofloor = dVar2;
        }
      }
    }
    if (v != (vertex_t **)0x0) {
      *v = local_50;
    }
    this_local = (sector_t *)ofloor;
  }
  return (double)this_local;
}

Assistant:

double sector_t::FindLowestFloorSurrounding (vertex_t **v) const
{
	int i;
	sector_t *other;
	line_t *check;
	double floor;
	double ofloor;
	vertex_t *spot;

	if (linecount == 0) return GetPlaneTexZ(sector_t::floor);

	spot = lines[0]->v1;
	floor = floorplane.ZatPoint(spot);

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			ofloor = other->floorplane.ZatPoint (check->v1);
			if (ofloor < floor && ofloor < floorplane.ZatPoint (check->v1))
			{
				floor = ofloor;
				spot = check->v1;
			}
			ofloor = other->floorplane.ZatPoint (check->v2);
			if (ofloor < floor && ofloor < floorplane.ZatPoint (check->v2))
			{
				floor = ofloor;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return floor;
}